

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::GoniometricLight::Scale(GoniometricLight *this,Vector3f wl,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  float fVar9;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [56];
  SampledSpectrum SVar14;
  undefined1 local_28 [16];
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  undefined1 auVar10 [56];
  undefined1 auVar12 [64];
  
  auVar11._4_60_ = wl._12_60_;
  auVar11._0_4_ = wl.super_Tuple3<pbrt::Vector3,_float>.z;
  local_28._8_8_ = in_XMM0_Qb;
  local_28._0_8_ = wl.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11._0_16_);
  uVar2 = vcmpss_avx512f(auVar11._0_16_,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar4 = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar6._0_4_));
  auVar6 = vmovshdup_avx(local_28);
  auVar7._0_4_ = atan2f(auVar6._0_4_,wl.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar7._4_60_ = extraout_var;
  auVar13 = (undefined1  [56])0x0;
  uVar2 = vcmpss_avx512f(auVar7._0_16_,ZEXT816(0) << 0x40,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar1 = this->scale;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar1;
  auVar6._8_4_ = fVar1;
  auVar6._12_4_ = fVar1;
  auVar10 = ZEXT856(auVar6._8_8_);
  SVar14 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar12._0_8_ = SVar14.values.values._8_8_;
  auVar12._8_56_ = auVar13;
  auVar8._0_8_ = SVar14.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  auVar6 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
  FVar5 = Image::GetChannel(&this->image,
                            (Point2i)(CONCAT44((int)((ulong)lambda >> 0x20),
                                               (int)((float)(this->image).resolution.
                                                            super_Tuple2<pbrt::Point2,_int>.x *
                                                    (float)((uint)bVar3 *
                                                            (int)(auVar7._0_4_ + 6.2831855) +
                                                           (uint)!bVar3 * (int)auVar7._0_4_) *
                                                    0.15915494)) |
                                     (ulong)(uint)(int)(fVar4 * 0.31830987 *
                                                       (float)(this->image).resolution.
                                                              super_Tuple2<pbrt::Point2,_int>.y) <<
                                     0x20),0,(WrapMode2D)0x200000002);
  fVar4 = FVar5 * auVar6._0_4_ * fVar1;
  fVar9 = FVar5 * auVar6._4_4_ * fVar1;
  auVar6 = CONCAT412(FVar5 * auVar6._12_4_ * fVar1,
                     CONCAT48(FVar5 * auVar6._8_4_ * fVar1,CONCAT44(fVar9,fVar4)));
  auVar6 = vshufpd_avx(auVar6,auVar6,1);
  SVar14.values.values._8_8_ = auVar6._0_8_;
  SVar14.values.values[0] = fVar4;
  SVar14.values.values[1] = fVar9;
  return (SampledSpectrum)SVar14.values.values;
}

Assistant:

Scale(Vector3f wl, const SampledWavelengths &lambda) const {
        Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
        Point2f st(phi * Inv2Pi, theta * InvPi);
        return scale * I.Sample(lambda) * image.LookupNearestChannel(st, 0);
    }